

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall Catch::Approx::toString_abi_cxx11_(string *__return_storage_ptr__,Approx *this)

{
  ReusableStringStream rss;
  ReusableStringStream RStack_48;
  string local_38;
  
  ReusableStringStream::ReusableStringStream(&RStack_48);
  std::operator<<(RStack_48.m_oss,"Approx( ");
  Detail::stringify<double>(&local_38,&this->m_value);
  std::operator<<(RStack_48.m_oss,(string *)&local_38);
  std::operator<<(RStack_48.m_oss," )");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&RStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Approx::toString() const {
        ReusableStringStream rss;
        rss << "Approx( " << ::Catch::Detail::stringify( m_value ) << " )";
        return rss.str();
    }